

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O3

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long ey;
  int iVar11;
  long ex;
  ulong uVar12;
  ulong uVar13;
  int local_60;
  
  uVar13 = worker->y;
  ey = (long)uVar13 >> 8;
  lVar6 = to_y >> 8;
  if ((ey < worker->max_ey || lVar6 < worker->max_ey) &&
     (worker->min_ey <= ey || worker->min_ey <= lVar6)) {
    uVar5 = worker->x;
    ex = (long)uVar5 >> 8;
    uVar8 = uVar5 & 0xff;
    iVar7 = (int)uVar8;
    uVar12 = uVar13 & 0xff;
    if ((long)(uVar13 ^ to_y) >> 8 != 0 || (long)(uVar5 ^ to_x) >> 8 != 0) {
      if (to_y == uVar13) {
        gray_set_cell(worker,to_x >> 8,ey);
      }
      else {
        lVar10 = to_y - uVar13;
        if (to_x == uVar5) {
          if (lVar10 < 1) {
            do {
              ey = ey + -1;
              worker->cover = worker->cover - uVar12;
              worker->area = worker->area + (int)uVar12 * iVar7 * -2;
              gray_set_cell(worker,ex,ey);
              uVar12 = 0x100;
            } while (ey != lVar6);
          }
          else {
            lVar10 = 0x100 - uVar12;
            uVar12 = 0;
            do {
              ey = ey + 1;
              worker->cover = worker->cover + lVar10;
              worker->area = worker->area + (int)lVar10 * iVar7 * 2;
              gray_set_cell(worker,ex,ey);
              lVar10 = 0x100;
            } while (ey != lVar6);
          }
        }
        else {
          lVar9 = to_x - uVar5;
          uVar5 = (ulong)(uint)((int)uVar12 * (int)lVar9 - (int)lVar10 * iVar7);
          lVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar9),0);
          lVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar10),0);
          uVar13 = uVar12;
          do {
            iVar11 = (int)uVar5;
            lVar4 = (long)iVar11;
            uVar5 = lVar4 + lVar9 * -0x100;
            iVar7 = (int)uVar8;
            if ((uVar5 == 0 || lVar4 < lVar9 * 0x100) || 0 < iVar11) {
              lVar1 = uVar5 + lVar10 * 0x100;
              if (((long)uVar5 < 1) && (0 < lVar1)) {
                uVar8 = -(int)uVar5 * lVar3;
                worker->cover = worker->cover + (0x100 - uVar13);
                worker->area = worker->area +
                               (int)(0x100 - uVar13) * (iVar7 + (uint)(byte)(uVar8 >> 0x38));
                ey = ey + 1;
                uVar5 = uVar5 & 0xffffffff;
                uVar12 = 0;
              }
              else {
                if ((lVar1 < 1) && (uVar5 = lVar10 * 0x100 + lVar4, -1 < (long)uVar5)) {
                  uVar12 = (ulong)((int)uVar5 * lVar2) >> 0x38;
                  worker->cover = worker->cover + (uVar12 - uVar13);
                  worker->area = worker->area + (int)(uVar12 - uVar13) * (iVar7 + 0x100);
                  ex = ex + 1;
                  uVar8 = 0;
                  goto LAB_0010a286;
                }
                uVar8 = -(lVar3 * lVar4);
                local_60 = (int)(lVar9 * 0x100);
                worker->cover = worker->cover - uVar13;
                worker->area = worker->area - (int)uVar13 * (iVar7 + (uint)(byte)(uVar8 >> 0x38));
                ey = ey + -1;
                uVar12 = 0x100;
                uVar5 = (ulong)(uint)(iVar11 + local_60);
              }
              uVar8 = uVar8 >> 0x38;
            }
            else {
              uVar12 = -((ulong)(uint)-iVar11 * lVar2) >> 0x38;
              worker->cover = worker->cover + (uVar12 - uVar13);
              worker->area = worker->area + iVar7 * (int)(uVar12 - uVar13);
              uVar5 = (ulong)(uint)(iVar11 + (int)lVar10 * -0x100);
              ex = ex + -1;
              uVar8 = 0x100;
            }
LAB_0010a286:
            iVar7 = (int)uVar8;
            gray_set_cell(worker,ex,ey);
            uVar13 = uVar12;
          } while ((ex != to_x >> 8) || (ey != lVar6));
        }
      }
    }
    lVar6 = (to_y & 0xffU) - uVar12;
    worker->cover = worker->cover + lVar6;
    worker->area = worker->area + (int)lVar6 * (iVar7 + ((uint)to_x & 0xff));
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void gray_render_line(RAS_ARG_ TPos to_x, TPos to_y)
{
    TPos   dx, dy, fx1, fy1, fx2, fy2;
    TCoord ex1, ex2, ey1, ey2;

    ex1 = TRUNC(ras.x);
    ex2 = TRUNC(to_x);
    ey1 = TRUNC(ras.y);
    ey2 = TRUNC(to_y);

    /* perform vertical clipping */
    if ((ey1 >= ras.max_ey && ey2 >= ras.max_ey) ||
        (ey1 < ras.min_ey && ey2 < ras.min_ey))
        goto End;

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    fx1 = ras.x - SUBPIXELS(ex1);
    fy1 = ras.y - SUBPIXELS(ey1);

    if (ex1 == ex2 && ey1 == ey2) /* inside one cell */
        ;
    else if (dy == 0) /* ex1 != ex2 */ /* any horizontal line */
    {
        ex1 = ex2;
        gray_set_cell(RAS_VAR_ ex1, ey1);
    } else if (dx == 0) {
        if (dy > 0) /* vertical line up */
            do {
                fy2 = ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * fx1 * 2;
                fy1 = 0;
                ey1++;
                gray_set_cell(RAS_VAR_ ex1, ey1);
            } while (ey1 != ey2);
        else /* vertical line down */
            do {
                fy2 = 0;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * fx1 * 2;
                fy1 = ONE_PIXEL;
                ey1--;
                gray_set_cell(RAS_VAR_ ex1, ey1);
            } while (ey1 != ey2);
    } else /* any other line */
    {
        TArea prod = dx * fy1 - dy * fx1;
        SW_FT_UDIVPREP(dx);
        SW_FT_UDIVPREP(dy);

        /* The fundamental value `prod' determines which side and the  */
        /* exact coordinate where the line exits current cell.  It is  */
        /* also easily updated when moving from one cell to the next.  */
        do {
            if (prod <= 0 && prod - dx * ONE_PIXEL > 0) /* left */
            {
                fx2 = 0;
                fy2 = (TPos)SW_FT_UDIV(-prod, -dx);
                prod -= dy * ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = ONE_PIXEL;
                fy1 = fy2;
                ex1--;
            } else if (prod - dx * ONE_PIXEL <= 0 &&
                       prod - dx * ONE_PIXEL + dy * ONE_PIXEL > 0) /* up */
            {
                prod -= dx * ONE_PIXEL;
                fx2 = (TPos)SW_FT_UDIV(-prod, dy);
                fy2 = ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = fx2;
                fy1 = 0;
                ey1++;
            } else if (prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                       prod + dy * ONE_PIXEL >= 0) /* right */
            {
                prod += dy * ONE_PIXEL;
                fx2 = ONE_PIXEL;
                fy2 = (TPos)SW_FT_UDIV(prod, dx);
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = 0;
                fy1 = fy2;
                ex1++;
            } else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                        prod                                   >  0 )    down */
            {
                fx2 = (TPos)SW_FT_UDIV(prod, -dy);
                fy2 = 0;
                prod += dx * ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = fx2;
                fy1 = ONE_PIXEL;
                ey1--;
            }

            gray_set_cell(RAS_VAR_ ex1, ey1);
        } while (ex1 != ex2 || ey1 != ey2);
    }

    fx2 = to_x - SUBPIXELS(ex2);
    fy2 = to_y - SUBPIXELS(ey2);

    ras.cover += (fy2 - fy1);
    ras.area += (fy2 - fy1) * (fx1 + fx2);

End:
    ras.x = to_x;
    ras.y = to_y;
}